

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_1_channels_with_n_coeffs_mod1
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *pfVar3;
  float *pfVar4;
  __m128 d;
  __m128 c;
  __m128 tot;
  float *local_200;
  float *hc;
  float *pfStack_1f0;
  int n;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_1d0;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  
  decode = output_buffer;
  pfStack_1d0 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar4 = decode_buffer + (int)*horizontal_coefficients_local;
    hc._4_4_ = ((int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local) + -1 >>
               2;
    local_200 = pfStack_1d0;
    local_f8 = (float)*(undefined8 *)pfStack_1d0;
    fStack_f4 = (float)((ulong)*(undefined8 *)pfStack_1d0 >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(pfStack_1d0 + 2);
    fStack_ec = (float)((ulong)*(undefined8 *)(pfStack_1d0 + 2) >> 0x20);
    local_108 = (float)*(undefined8 *)pfVar4;
    fStack_104 = (float)((ulong)*(undefined8 *)pfVar4 >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfVar4 + 2);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfVar4 + 2) >> 0x20);
    c[2] = local_f8 * local_108;
    c[3] = fStack_f4 * fStack_104;
    tot[0] = fStack_f0 * fStack_100;
    tot[1] = fStack_ec * fStack_fc;
    pfVar3 = local_200;
    do {
      pfStack_1f0 = pfVar4;
      local_200 = pfVar3;
      uVar1 = *(undefined8 *)(local_200 + 4);
      uVar2 = *(undefined8 *)(pfStack_1f0 + 4);
      local_118 = (float)uVar1;
      fStack_114 = (float)((ulong)uVar1 >> 0x20);
      fStack_110 = (float)*(undefined8 *)(local_200 + 6);
      fStack_10c = (float)((ulong)*(undefined8 *)(local_200 + 6) >> 0x20);
      local_128 = (float)uVar2;
      fStack_124 = (float)((ulong)uVar2 >> 0x20);
      fStack_120 = (float)*(undefined8 *)(pfStack_1f0 + 6);
      fStack_11c = (float)((ulong)*(undefined8 *)(pfStack_1f0 + 6) >> 0x20);
      c[2] = c[2] + local_118 * local_128;
      c[3] = c[3] + fStack_114 * fStack_124;
      tot[0] = tot[0] + fStack_110 * fStack_120;
      tot[1] = tot[1] + fStack_10c * fStack_11c;
      hc._4_4_ = hc._4_4_ + -1;
      pfVar3 = local_200 + 4;
      pfVar4 = pfStack_1f0 + 4;
    } while (0 < hc._4_4_);
    *decode = c[2] + pfStack_1f0[8] * local_200[8] + tot[0] + 0.0 + c[3] + 0.0 + tot[1] + 0.0;
    pfStack_1d0 = pfStack_1d0 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 1;
  } while (decode < output_buffer + output_sub_size);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod1 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 5 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__1_coeff_remnant( 4 );
    stbir__store_output();
  } while ( output < output_end );
}